

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IBlockReader.cpp
# Opt level: O3

void __thiscall IBlockReader::getWord(IBlockReader *this,string *str)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  
  cVar2 = std::istream::get();
  if (cVar2 == '{') {
    cVar2 = (char)str;
    std::__cxx11::string::push_back(cVar2);
    this->m_hasChild = true;
    iVar3 = std::istream::get();
    do {
      iVar3 = iVar3 << 0x18;
      if (iVar3 == -0x1000000) {
        return;
      }
      std::__cxx11::string::push_back(cVar2);
      if (iVar3 == 0x7d000000) {
        bVar1 = false;
      }
      else {
        bVar1 = true;
        if (iVar3 == 0xa000000) {
          std::__cxx11::string::push_back(cVar2);
        }
      }
      iVar3 = std::istream::get();
    } while (bVar1);
  }
  return;
}

Assistant:

void IBlockReader::getWord(std::string &str) {
    char tempChar;
    int num_3l;

    tempChar=m_ifs->get();
    if(tempChar=='{')
    {
        str+=tempChar;
        m_hasChild= true;
        num_3l=1;

        while ((tempChar=m_ifs->get())!=EOF&&num_3l)
        {
            str+=tempChar;
            if(tempChar=='\n')
            {
                str+='\n';
            }
            else if(tempChar=='}')
                num_3l--;
        }
    }
}